

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

void __thiscall
lsim::ModelWire::remove_segment_from_junction
          (ModelWire *this,ModelWireJunction *junction,ModelWireSegment *segment)

{
  size_t sVar1;
  ModelWireSegment *segment_local;
  ModelWireJunction *junction_local;
  ModelWire *this_local;
  
  if (junction == (ModelWireJunction *)0x0) {
    __assert_fail("junction",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_wire.cpp"
                  ,0x118,
                  "void lsim::ModelWire::remove_segment_from_junction(ModelWireJunction *, ModelWireSegment *)"
                 );
  }
  if (segment != (ModelWireSegment *)0x0) {
    ModelWireJunction::remove_segment(junction,segment);
    sVar1 = ModelWireJunction::num_segments(junction);
    if (sVar1 == 0) {
      remove_junction(this,junction);
    }
    return;
  }
  __assert_fail("segment",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_wire.cpp"
                ,0x119,
                "void lsim::ModelWire::remove_segment_from_junction(ModelWireJunction *, ModelWireSegment *)"
               );
}

Assistant:

void ModelWire::remove_segment_from_junction(ModelWireJunction *junction, ModelWireSegment *segment) {
    assert(junction);
    assert(segment);
    junction->remove_segment(segment);
    if (junction->num_segments() == 0) {
        remove_junction(junction);
    }
}